

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O3

IntrinsicResult MiniScript::intrinsic_len(Context *context,IntrinsicResult partialResult)

{
  bool *pbVar1;
  ListStorage<MiniScript::TACLine> *pLVar2;
  undefined8 uVar3;
  long *plVar4;
  undefined4 *puVar5;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *pDVar6;
  _func_int **pp_Var7;
  Value val;
  undefined1 local_80 [16];
  long *local_70;
  char local_68;
  Value local_60;
  Value local_50;
  Value local_40;
  ValueDict local_30;
  
  local_68 = '\0';
  plVar4 = (long *)operator_new(0x30);
  plVar4[1] = 1;
  *plVar4 = (long)&PTR__StringStorage_001bf0d8;
  plVar4[3] = 5;
  plVar4[4] = -1;
  puVar5 = (undefined4 *)operator_new__(5);
  plVar4[2] = (long)puVar5;
  *(undefined1 *)(puVar5 + 1) = 0;
  *puVar5 = 0x666c6573;
  local_70 = plVar4;
  Context::GetVar((Context *)local_80,(String *)partialResult.rs,(LocalOnlyMode)&local_70);
  if ((local_70 != (long *)0x0) && (local_68 == '\0')) {
    plVar4 = local_70 + 1;
    *plVar4 = *plVar4 + -1;
    if (*plVar4 == 0) {
      (**(code **)(*local_70 + 8))();
    }
    local_70 = (long *)0x0;
  }
  uVar3 = local_80._8_8_;
  if (local_80[0] == String) {
    if ((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_80._8_8_ ==
        (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) {
      pDVar6 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0;
    }
    else {
      *(long *)(local_80._8_8_ + 8) = *(long *)(local_80._8_8_ + 8) + 1;
      pDVar6 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)
               ((RefCountedStorage *)(local_80._8_8_ + 0x20))->_vptr_RefCountedStorage;
      if ((long)pDVar6 < 0) {
        StringStorage::analyzeChars((StringStorage *)local_80._8_8_);
        pDVar6 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)
                 ((RefCountedStorage *)(uVar3 + 0x20))->_vptr_RefCountedStorage;
      }
    }
    local_50.data.number = (double)(long)pDVar6;
    local_50.type = Number;
    local_50.noInvoke = false;
    local_50.localOnly = Off;
    (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
    IntrinsicResult::ensureStorage((IntrinsicResult *)context);
    Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                     &local_50);
    *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
    if ((Temp < local_50.type) &&
       ((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_50.data.ref !=
        (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0)) {
      plVar4 = &(local_50.data.ref)->refCount;
      *plVar4 = *plVar4 + -1;
      if (*plVar4 == 0) {
        (*((RefCountedStorage *)&(local_50.data.ref)->_vptr_RefCountedStorage)->
          _vptr_RefCountedStorage[1])();
      }
      local_50.data.number = 0.0;
    }
LAB_0014856b:
    if ((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)uVar3 ==
        (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) goto LAB_00148614;
    pbVar1 = (bool *)(uVar3 + 8);
    *(long *)pbVar1 = *(long *)pbVar1 + -1;
    if (*(long *)pbVar1 != 0) goto LAB_00148614;
    pp_Var7 = ((RefCountedStorage *)uVar3)->_vptr_RefCountedStorage;
    local_30.ds = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)uVar3;
  }
  else {
    if (local_80[0] != Map) {
      if (local_80[0] != List) {
        IntrinsicResult::ensureStorage((IntrinsicResult *)&IntrinsicResult::Null);
        pLVar2 = IntrinsicResult::Null;
        (context->code).ls = IntrinsicResult::Null;
        if (pLVar2 != (ListStorage<MiniScript::TACLine> *)0x0) {
          plVar4 = &(pLVar2->super_RefCountedStorage).refCount;
          *plVar4 = *plVar4 + 1;
        }
        goto LAB_00148614;
      }
      if ((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_80._8_8_ ==
          (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) {
        local_40.data.number = 0.0;
      }
      else {
        *(long *)(local_80._8_8_ + 8) = *(long *)(local_80._8_8_ + 8) + 1;
        local_40.data.number =
             (double)(long)((RefCountedStorage *)(local_80._8_8_ + 0x20))->_vptr_RefCountedStorage;
      }
      local_40.type = Number;
      local_40.noInvoke = false;
      local_40.localOnly = Off;
      (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
      IntrinsicResult::ensureStorage((IntrinsicResult *)context);
      Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).
                                 mBuf,&local_40);
      *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems =
           1;
      if ((2 < local_40.type) &&
         ((ListStorage<MiniScript::Value> *)local_40.data.ref !=
          (ListStorage<MiniScript::Value> *)0x0)) {
        plVar4 = &(local_40.data.ref)->refCount;
        *plVar4 = *plVar4 + -1;
        if (*plVar4 == 0) {
          (*((RefCountedStorage *)&(local_40.data.ref)->_vptr_RefCountedStorage)->
            _vptr_RefCountedStorage[1])();
        }
        local_40.data.number = 0.0;
      }
      goto LAB_0014856b;
    }
    Value::GetDict(&local_30,(Value *)local_80);
    if (local_30.ds == (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) {
      local_60.data.number = 0.0;
    }
    else {
      local_60.data.number =
           (double)(long)((RefCountedStorage *)((long)local_30.ds + 0x10))->_vptr_RefCountedStorage;
    }
    local_60.type = Number;
    local_60.noInvoke = false;
    local_60.localOnly = Off;
    (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
    IntrinsicResult::ensureStorage((IntrinsicResult *)context);
    Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                     &local_60);
    *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
    if ((Temp < local_60.type) && (local_60.data.ref != (RefCountedStorage *)0x0)) {
      plVar4 = &(local_60.data.ref)->refCount;
      *plVar4 = *plVar4 + -1;
      if (*plVar4 == 0) {
        (*(local_60.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_60.data.number = 0.0;
    }
    local_30._vptr_Dictionary = (_func_int **)&PTR__Dictionary_001bf240;
    if ((local_30.ds == (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) ||
       (local_30.isTemp != false)) goto LAB_00148614;
    pbVar1 = (bool *)((long)local_30.ds + 8);
    *(long *)pbVar1 = *(long *)pbVar1 + -1;
    if (*(long *)pbVar1 != 0) goto LAB_00148614;
    pp_Var7 = ((local_30.ds)->super_RefCountedStorage)._vptr_RefCountedStorage;
  }
  (*pp_Var7[1])(local_30.ds);
LAB_00148614:
  if ((Temp < local_80[0]) &&
     ((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_80._8_8_ !=
      (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0)) {
    pbVar1 = (bool *)(local_80._8_8_ + 8);
    *(long *)pbVar1 = *(long *)pbVar1 + -1;
    if (*(long *)pbVar1 == 0) {
      (*((RefCountedStorage *)local_80._8_8_)->_vptr_RefCountedStorage[1])();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_len(Context *context, IntrinsicResult partialResult) {
		Value val = context->GetVar("self");
		if (val.type == ValueType::List) {
			ValueList list = val.GetList();
			return IntrinsicResult(list.Count());
		} else if (val.type == ValueType::String) {
			String str = val.GetString();
			return IntrinsicResult(str.Length());
		} else if (val.type == ValueType::Map) {
			return IntrinsicResult(val.GetDict().Count());
		}
		return IntrinsicResult::Null;
	}